

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

TValue * lj_meta_tset(lua_State *L,cTValue *o,cTValue *k)

{
  uint uVar1;
  bool bVar2;
  TValue *pTVar3;
  ulong uVar4;
  GCtab *t;
  cTValue *unaff_RBX;
  GCobj *o_1;
  GCtab *t_00;
  int iVar5;
  TValue tmp;
  cTValue *local_50;
  cTValue local_38;
  
  iVar5 = 100;
  do {
    if ((o->field_2).it == 0xfffffff4) {
      uVar1 = (o->u32).lo;
      t_00 = (GCtab *)(ulong)uVar1;
      pTVar3 = lj_tab_get(L,t_00,k);
      if ((pTVar3->field_2).it == 0xffffffff) {
        t = (GCtab *)(ulong)(t_00->metatable).gcptr32;
        if (t == (GCtab *)0x0) {
          local_50 = (cTValue *)0x0;
        }
        else {
          if ((t->nomm & 2) == 0) {
            local_50 = lj_tab_getstr(t,(GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x19c));
            if ((local_50 != (cTValue *)0x0) && ((local_50->field_2).it != 0xffffffff))
            goto LAB_00117036;
            t->nomm = t->nomm | 2;
          }
          local_50 = (cTValue *)0x0;
        }
LAB_00117036:
        bVar2 = true;
        if (local_50 == (cTValue *)0x0) {
          t_00->nomm = '\0';
          if ((t_00->marked & 4) != 0) {
            uVar4 = (ulong)(L->glref).ptr32;
            t_00->marked = t_00->marked & 0xfb;
            (t_00->gclist).gcptr32 = *(uint32_t *)(uVar4 + 0x6c);
            *(uint *)(uVar4 + 0x6c) = uVar1;
          }
          if (pTVar3 == (cTValue *)((ulong)(L->glref).ptr32 + 0x130)) {
            if ((k->field_2).it == 0xffffffff) {
              lj_err_msg(L,LJ_ERR_NILIDX);
            }
            if (((k->field_2).it < 0xfffeffff) && (NAN(k->n))) {
              lj_err_msg(L,LJ_ERR_NANIDX);
            }
            pTVar3 = lj_tab_newkey(L,t_00,k);
          }
          local_50 = (cTValue *)0x0;
          bVar2 = false;
          unaff_RBX = pTVar3;
        }
      }
      else {
        t_00->nomm = '\0';
        unaff_RBX = pTVar3;
        if ((t_00->marked & 4) == 0) {
          bVar2 = false;
        }
        else {
          uVar4 = (ulong)(L->glref).ptr32;
          t_00->marked = t_00->marked & 0xfb;
          (t_00->gclist).gcptr32 = *(uint32_t *)(uVar4 + 0x6c);
          *(uint *)(uVar4 + 0x6c) = uVar1;
          bVar2 = false;
        }
      }
      if (bVar2) goto LAB_00116f2b;
LAB_00116f96:
      bVar2 = false;
    }
    else {
      local_50 = lj_meta_lookup(L,o,MM_newindex);
      if ((local_50->field_2).it == 0xffffffff) {
        lj_err_optype(L,o,LJ_ERR_OPINDEX);
      }
LAB_00116f2b:
      if ((local_50->field_2).it == 0xfffffff7) {
        uVar4 = (ulong)L->base[-1].u32.lo;
        if (*(char *)(uVar4 + 6) == '\0') {
          pTVar3 = L->base + *(byte *)((ulong)*(uint *)(uVar4 + 0x10) - 0x39);
        }
        else {
          pTVar3 = L->top;
        }
        pTVar3->n = 4.00934271600172e-320;
        pTVar3[1].field_2 = *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)local_50;
        pTVar3[2] = *o;
        pTVar3[3] = *k;
        L->top = pTVar3 + 2;
        unaff_RBX = (cTValue *)0x0;
        goto LAB_00116f96;
      }
      local_38.field_2 = *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)local_50;
      bVar2 = true;
      o = &local_38;
    }
    if (!bVar2) {
      return unaff_RBX;
    }
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      lj_err_msg(L,LJ_ERR_SETLOOP);
    }
  } while( true );
}

Assistant:

TValue *lj_meta_tset(lua_State *L, cTValue *o, cTValue *k)
{
  TValue tmp;
  int loop;
  for (loop = 0; loop < LJ_MAX_IDXCHAIN; loop++) {
    cTValue *mo;
    if (LJ_LIKELY(tvistab(o))) {
      GCtab *t = tabV(o);
      cTValue *tv = lj_tab_get(L, t, k);
      if (LJ_LIKELY(!tvisnil(tv))) {
	t->nomm = 0;  /* Invalidate negative metamethod cache. */
	lj_gc_anybarriert(L, t);
	return (TValue *)tv;
      } else if (!(mo = lj_meta_fast(L, tabref(t->metatable), MM_newindex))) {
	t->nomm = 0;  /* Invalidate negative metamethod cache. */
	lj_gc_anybarriert(L, t);
	if (tv != niltv(L))
	  return (TValue *)tv;
	if (tvisnil(k)) lj_err_msg(L, LJ_ERR_NILIDX);
	else if (tvisint(k)) { setnumV(&tmp, (lua_Number)intV(k)); k = &tmp; }
	else if (tvisnum(k) && tvisnan(k)) lj_err_msg(L, LJ_ERR_NANIDX);
	return lj_tab_newkey(L, t, k);
      }
    } else if (tvisnil(mo = lj_meta_lookup(L, o, MM_newindex))) {
      lj_err_optype(L, o, LJ_ERR_OPINDEX);
      return NULL;  /* unreachable */
    }
    if (tvisfunc(mo)) {
      L->top = mmcall(L, lj_cont_nop, mo, o, k);
      /* L->top+2 = v filled in by caller. */
      return NULL;  /* Trigger metamethod call. */
    }
    copyTV(L, &tmp, mo);
    o = &tmp;
  }
  lj_err_msg(L, LJ_ERR_SETLOOP);
  return NULL;  /* unreachable */
}